

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

size_t intersect_accel<true,false,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  Vec<float,_3UL> *pVVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  Index IVar5;
  pointer pNVar6;
  pointer pPVar7;
  bool bVar8;
  int iVar9;
  Index IVar10;
  long lVar11;
  Index IVar12;
  uint uVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  Index IVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  uint uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  undefined8 local_220;
  float local_218;
  ulong local_210;
  size_t local_208;
  Accel *local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  TraversalStats *local_1c0;
  Vec<float,_3UL> *local_1b8;
  size_t local_1b0;
  float local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Type local_134 [64];
  uint local_34;
  
  local_1b8 = &ray->dir;
  auVar23 = SUB6416(ZEXT464(0x3f800000),0);
  local_148 = vdivss_avx512f(auVar23,ZEXT416((uint)(ray->dir).values[0]));
  auVar35 = ZEXT1664(local_148);
  uVar13 = local_148._0_4_;
  local_158 = vdivss_avx512f(auVar23,ZEXT416((uint)(ray->dir).values[1]));
  auVar36 = ZEXT1664(local_158);
  uVar18 = local_158._0_4_;
  local_168 = vdivss_avx512f(auVar23,ZEXT416((uint)(ray->dir).values[2]));
  auVar38 = ZEXT1664(local_168);
  uVar37 = local_168._0_4_;
  bVar8 = (uVar13 & 0x7fffffff) < 0x7f800000;
  local_178._4_12_ = local_148._4_12_;
  local_178._0_4_ = (uint)bVar8 * (uVar13 + 2) + !bVar8 * uVar13;
  auVar39 = ZEXT1664(local_178);
  bVar8 = (uVar18 & 0x7fffffff) < 0x7f800000;
  local_188._4_12_ = local_158._4_12_;
  local_188._0_4_ = (uint)bVar8 * (uVar18 + 2) + !bVar8 * uVar18;
  auVar40 = ZEXT1664(local_188);
  bVar8 = (uVar37 & 0x7fffffff) < 0x7f800000;
  local_198._4_12_ = local_168._4_12_;
  local_198._0_4_ = (uint)bVar8 * (uVar37 + 2) + !bVar8 * uVar37;
  auVar41 = ZEXT1664(local_198);
  iVar9 = (int)(ray->dir).values[0] >> 0x1f;
  uVar13 = -((int)(ray->dir).values[2] >> 0x1f);
  uVar18 = -((int)(ray->dir).values[1] >> 0x1f);
  local_134[0] = (((accel->bvh).nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index).value;
  uVar22 = (ulong)(uint)(iVar9 * -4);
  local_34 = 1;
  local_208 = 0xffffffffffffffff;
  uVar21 = (ulong)((uVar18 + 2) * 4);
  uVar20 = (ulong)((uVar13 + 4) * 4);
  uVar15 = (ulong)((-iVar9 ^ 1U) << 2);
  uVar19 = (ulong)((uVar18 ^ 3) << 2);
  uVar14 = (ulong)((uVar13 ^ 5) << 2);
  local_210 = uVar15;
  local_200 = accel;
  local_1e8 = uVar22;
  local_1e0 = uVar20;
  local_1d8 = uVar21;
  local_1d0 = uVar14;
  local_1c8 = uVar19;
  local_1c0 = stats;
  do {
    local_34 = local_34 - 1;
    IVar12.value = local_134[local_34];
    pNVar6 = (local_200->bvh).nodes.
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar32 = (ray->org).values[0];
    fVar31 = (ray->org).values[1];
    fVar33 = (ray->org).values[2];
    fVar2 = ray->tmin;
    fVar3 = ray->tmax;
    sVar17 = stats->visited_nodes;
    while( true ) {
      sVar17 = sVar17 + 1;
      uVar13 = IVar12.value >> 4;
      if ((IVar12.value & 0xf) != 0) break;
      stats->visited_nodes = sVar17;
      auVar23 = vmulss_avx512f(auVar35._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar13) + uVar22) - fVar32)
                                      ));
      auVar24 = vmulss_avx512f(auVar36._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar13) + uVar21) - fVar31)
                                      ));
      auVar25 = vmulss_avx512f(auVar38._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar13) + uVar20) - fVar33)
                                      ));
      auVar26 = vmulss_avx512f(auVar39._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar13) + uVar15) - fVar32)
                                      ));
      auVar27 = vmulss_avx512f(auVar40._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar13) + uVar19) - fVar31)
                                      ));
      auVar28 = vmulss_avx512f(auVar41._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar13) + uVar14) - fVar33)
                                      ));
      auVar23 = vmaxss_avx(auVar23,ZEXT416((uint)fVar2));
      auVar23 = vmaxss_avx(auVar24,auVar23);
      auVar23 = vmaxss_avx(auVar25,auVar23);
      auVar24 = vminss_avx(auVar26,ZEXT416((uint)fVar3));
      auVar24 = vminss_avx(auVar27,auVar24);
      auVar25 = vminss_avx(auVar28,auVar24);
      auVar24 = vmulss_avx512f(auVar35._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar13 + 1) + uVar22
                                                        ) - fVar32)));
      auVar26 = vmulss_avx512f(auVar36._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar13 + 1) + uVar21
                                                        ) - fVar31)));
      auVar27 = vmulss_avx512f(auVar38._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar13 + 1) + uVar20
                                                        ) - fVar33)));
      auVar28 = vsubss_avx512f(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar13 + 1) + uVar14)),
                               ZEXT416((uint)fVar33));
      auVar29 = vmulss_avx512f(auVar39._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar13 + 1) + uVar15
                                                        ) - fVar32)));
      auVar30 = vmulss_avx512f(auVar40._0_16_,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar13 + 1) + uVar19
                                                        ) - fVar31)));
      auVar28 = vmulss_avx512f(auVar41._0_16_,auVar28);
      auVar24 = vmaxss_avx(auVar24,ZEXT416((uint)fVar2));
      auVar24 = vmaxss_avx(auVar26,auVar24);
      auVar24 = vmaxss_avx(auVar27,auVar24);
      auVar26 = vminss_avx(auVar29,ZEXT416((uint)fVar3));
      auVar26 = vminss_avx(auVar30,auVar26);
      auVar26 = vminss_avx(auVar28,auVar26);
      fVar34 = auVar24._0_4_;
      if (auVar23._0_4_ <= auVar25._0_4_) {
        IVar12.value = ((Index *)((long)(pNVar6 + uVar13) + 0x18))->value;
        bVar8 = true;
        if (fVar34 <= auVar26._0_4_) {
          uVar15 = (ulong)local_34;
          if (0x3f < uVar15) {
            __assert_fail("!is_full()",
                          "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                          ,0x15,
                          "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                         );
          }
          IVar5.value = ((Index *)((long)(pNVar6 + (ulong)uVar13 + 1) + 0x18))->value;
          IVar10.value = IVar5.value;
          IVar16.value = IVar12.value;
          if (auVar23._0_4_ <= fVar34) {
            IVar10.value = IVar12.value;
            IVar16.value = IVar5.value;
          }
          IVar12.value = IVar10.value;
          local_34 = local_34 + 1;
          local_134[uVar15] = IVar16.value;
          uVar15 = local_210;
        }
      }
      else if (auVar26._0_4_ < fVar34) {
        bVar8 = false;
      }
      else {
        IVar12.value = ((Index *)((long)(pNVar6 + (ulong)uVar13 + 1) + 0x18))->value;
        bVar8 = true;
      }
      if (!bVar8) goto joined_r0x00107f44;
    }
    stats->visited_leaves = stats->visited_leaves + 1;
    uVar15 = (ulong)uVar13;
    do {
      sVar17 = (local_200->bvh).prim_ids.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15];
      pPVar7 = (local_200->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = &pPVar7[sVar17].n;
      auVar23 = vinsertps_avx(ZEXT416((uint)((((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values
                                             [0] - (ray->org).values[0])),
                              ZEXT416((uint)((((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values
                                             [1] - (ray->org).values[1])),0x10);
      local_218 = (((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[2] - (ray->org).values[2];
      uVar4 = vmovlps_avx(auVar23);
      fVar32 = (ray->dir).values[0];
      fVar31 = (ray->dir).values[1];
      fVar33 = (ray->dir).values[2];
      local_220._0_4_ = (float)uVar4;
      local_220._4_4_ = (float)((ulong)uVar4 >> 0x20);
      auVar23 = vfmsub231ss_fma(ZEXT416((uint)(local_220._4_4_ * fVar33)),ZEXT416((uint)fVar31),
                                ZEXT416((uint)local_218));
      auVar24 = vfmsub231ss_fma(ZEXT416((uint)(local_218 * fVar32)),ZEXT416((uint)(float)local_220),
                                ZEXT416((uint)fVar33));
      auVar23 = vinsertps_avx(auVar23,auVar24,0x10);
      auVar24 = vfmsub231ss_fma(ZEXT416((uint)((float)local_220 * fVar31)),ZEXT416((uint)fVar32),
                                ZEXT416((uint)local_220._4_4_));
      local_1f8 = vmovlps_avx(auVar23);
      local_1f0 = auVar24._0_4_;
      local_220 = uVar4;
      local_1b0 = sVar17;
      fVar31 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar1,pPVar7 + sVar17 + 1,local_1b8);
      fVar32 = 0.0;
      lVar11 = 0;
      do {
        fVar32 = fVar32 + *(float *)((long)&local_1f8 + lVar11) *
                          *(float *)((long)pPVar7[sVar17].e2.values + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      fVar33 = 0.0;
      lVar11 = 0;
      do {
        fVar33 = fVar33 + *(float *)((long)&local_1f8 + lVar11) *
                          *(float *)((long)pPVar7[sVar17].e1.values + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      fVar31 = 1.0 / fVar31;
      uVar22 = 0;
      if (((-1.1920929e-07 <= fVar31 * fVar32) && (-1.1920929e-07 <= fVar31 * fVar33)) &&
         (-1.1920929e-07 <= (1.0 - fVar31 * fVar32) - fVar31 * fVar33)) {
        fVar32 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar1,pPVar7 + sVar17 + 1,&local_220);
        fVar32 = fVar32 * fVar31;
        uVar22 = vcmpps_avx512vl(ZEXT416((uint)ray->tmin),ZEXT416((uint)fVar32),2);
        uVar20 = vcmpps_avx512vl(ZEXT416((uint)fVar32),ZEXT416((uint)ray->tmax),2);
        uVar22 = uVar22 & uVar20;
        local_1a8 = (float)((uint)((byte)uVar22 & 1) * (int)fVar32 +
                           (uint)!(bool)((byte)uVar22 & 1) * (int)local_1a8);
      }
      if ((uVar22 & 1) != 0) {
        ray->tmax = local_1a8;
        local_208 = local_1b0;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (IVar12.value & 0xf) + uVar13);
    auVar35 = ZEXT1664(local_148);
    auVar36 = ZEXT1664(local_158);
    auVar38 = ZEXT1664(local_168);
    auVar39 = ZEXT1664(local_178);
    auVar40 = ZEXT1664(local_188);
    auVar41 = ZEXT1664(local_198);
    uVar15 = local_210;
    uVar22 = local_1e8;
    uVar20 = local_1e0;
    uVar21 = local_1d8;
    uVar14 = local_1d0;
    uVar19 = local_1c8;
    stats = local_1c0;
joined_r0x00107f44:
    if (local_34 == 0) {
      return local_208;
    }
  } while( true );
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}